

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_self(FuncState *fs,expdesc *e,expdesc *key)

{
  int b;
  
  luaK_exp2anyreg(fs,e);
  b = (e->u).info;
  freeexp(fs,e);
  *(uint *)&e->u = (uint)fs->freereg;
  e->k = VNONRELOC;
  luaK_reserveregs(fs,2);
  codeABRK(fs,OP_SELF,(e->u).info,b,key);
  freeexp(fs,key);
  return;
}

Assistant:

void luaK_self (FuncState *fs, expdesc *e, expdesc *key) {
  int ereg;
  luaK_exp2anyreg(fs, e);
  ereg = e->u.info;  /* register where 'e' was placed */
  freeexp(fs, e);
  e->u.info = fs->freereg;  /* base register for op_self */
  e->k = VNONRELOC;  /* self expression has a fixed register */
  luaK_reserveregs(fs, 2);  /* function and 'self' produced by op_self */
  codeABRK(fs, OP_SELF, e->u.info, ereg, key);
  freeexp(fs, key);
}